

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftzopen.c
# Opt level: O1

FT_ULong ft_lzwstate_io(FT_LzwState state,FT_Byte *buffer,FT_ULong out_size)

{
  FT_Byte FVar1;
  FT_LzwPhase FVar2;
  uint uVar3;
  FT_Error FVar4;
  FT_UInt FVar5;
  uint uVar6;
  int iVar7;
  FT_ULong FVar8;
  FT_UShort *pFVar9;
  byte bVar10;
  uint uVar11;
  ulong new_count;
  ulong cur_count;
  uint uVar12;
  uint uVar13;
  FT_ULong FVar14;
  FT_Byte max_bits;
  FT_Error error;
  byte local_49;
  size_t local_48;
  int local_3c;
  FT_ULong local_38;
  
  uVar13 = state->old_code;
  uVar12 = state->old_char;
  uVar6 = state->in_code;
  if (out_size == 0) {
    FVar8 = 0;
    goto LAB_00273e98;
  }
  FVar2 = state->phase;
  FVar14 = 0;
  FVar8 = out_size;
  local_38 = out_size;
  if (FVar2 == FT_LZW_PHASE_STACK) goto LAB_00273dbb;
  if (FVar2 == FT_LZW_PHASE_CODE) {
LAB_00273c60:
    while( true ) {
      local_48 = CONCAT44(local_48._4_4_,uVar6);
      uVar6 = ft_lzwstate_get_code(state);
      if ((int)uVar6 < 0) break;
      while ((uVar6 == 0x100 && (state->block_mode != 0))) {
        state->free_ent = 0;
        state->buf_clear = '\x01';
        uVar6 = ft_lzwstate_get_code(state);
        if ((int)uVar6 < 0) {
          uVar12 = 0;
          uVar13 = 0;
          goto LAB_00273e88;
        }
        uVar12 = 0;
        uVar13 = 0;
      }
      uVar11 = uVar6;
      if (0xff < uVar6) {
        if (state->free_ent <= uVar6 - 0x100) {
          if ((state->free_ent < uVar6 - 0x100) ||
             ((state->stack_size <= (ulong)state->stack_top &&
              (iVar7 = ft_lzwstate_stack_grow(state), iVar7 < 0)))) goto LAB_00273e92;
          uVar11 = state->stack_top;
          state->stack_top = uVar11 + 1;
          state->stack[uVar11] = (FT_Byte)uVar12;
          uVar11 = uVar13;
        }
        for (; 0xff < uVar11; uVar11 = (uint)state->prefix[uVar11 - 0x100]) {
          if ((state->prefix == (FT_UShort *)0x0) ||
             ((state->stack_size <= (ulong)state->stack_top &&
              (iVar7 = ft_lzwstate_stack_grow(state), iVar7 < 0)))) goto LAB_00273e92;
          FVar1 = state->suffix[uVar11 - 0x100];
          uVar3 = state->stack_top;
          state->stack_top = uVar3 + 1;
          state->stack[uVar3] = FVar1;
        }
      }
      uVar12 = uVar11;
      if ((state->stack_size <= (ulong)state->stack_top) &&
         (iVar7 = ft_lzwstate_stack_grow(state), iVar7 < 0)) goto LAB_00273e92;
      uVar11 = state->stack_top;
      state->stack_top = uVar11 + 1;
      state->stack[uVar11] = (FT_Byte)uVar12;
      state->phase = FT_LZW_PHASE_STACK;
      FVar8 = local_38;
LAB_00273dbb:
      while (state->stack_top != 0) {
        uVar11 = state->stack_top - 1;
        state->stack_top = uVar11;
        if (buffer != (FT_Byte *)0x0) {
          buffer[FVar14] = state->stack[uVar11];
        }
        FVar14 = FVar14 + 1;
        if (FVar8 == FVar14) goto LAB_00273e98;
      }
      if (state->free_ent < state->max_free) {
        uVar11 = state->prefix_size;
        cur_count = (ulong)uVar11;
        if (uVar11 <= state->free_ent) {
          new_count = 0x200;
          if (cur_count != 0) {
            new_count = (ulong)((uVar11 >> 2) + uVar11);
          }
          local_48 = cur_count;
          pFVar9 = (FT_UShort *)
                   ft_mem_realloc(state->memory,3,cur_count,new_count,state->prefix,&local_3c);
          state->prefix = pFVar9;
          if (local_3c != 0) goto LAB_00273e92;
          state->suffix = (FT_Byte *)(pFVar9 + new_count);
          memmove(pFVar9 + new_count,pFVar9 + local_48,local_48);
          state->prefix_size = (FT_UInt)new_count;
        }
        uVar11 = state->free_ent;
        state->prefix[uVar11] = (FT_UShort)uVar13;
        state->suffix[uVar11] = (FT_Byte)uVar12;
        state->free_ent = state->free_ent + 1;
      }
      state->phase = FT_LZW_PHASE_CODE;
      uVar13 = uVar6;
    }
LAB_00273e88:
    uVar6 = (uint)local_48;
  }
  else {
    FVar8 = FVar14;
    if (FVar2 != FT_LZW_PHASE_START) goto LAB_00273e98;
    FVar4 = FT_Stream_Seek(state->source,2);
    iVar7 = 4;
    if ((FVar4 == 0) && (FVar8 = FT_Stream_TryRead(state->source,&local_49,1), FVar8 == 1)) {
      uVar11 = local_49 & 0x1f;
      state->max_bits = uVar11;
      state->block_mode = local_49 & 0xffffff80;
      bVar10 = (byte)uVar11;
      state->max_free = (1 << bVar10) - 0x100;
      if (0x10 < bVar10) goto LAB_00273c0e;
      state->num_bits = 9;
      state->free_ent = (uint)(local_49 >> 7);
      FVar5 = 0x100;
      if (bVar10 < 10) {
        FVar5 = (1 << bVar10) - 0xff;
      }
      state->free_bits = FVar5;
      uVar6 = ft_lzwstate_get_code(state);
      if (0xff < uVar6) {
        uVar6 = 0;
        goto LAB_00273c0e;
      }
      if (buffer != (FT_Byte *)0x0) {
        *buffer = (FT_Byte)uVar6;
      }
      iVar7 = 2;
      FVar14 = 1;
      uVar13 = uVar6;
      uVar12 = uVar6;
      if (local_38 == 1) {
        uVar6 = 0;
      }
      else {
        state->phase = FT_LZW_PHASE_CODE;
        uVar6 = 0;
        iVar7 = 0;
      }
    }
    else {
LAB_00273c0e:
      FVar14 = 0;
    }
    if (iVar7 != 4) {
      FVar8 = FVar14;
      if (iVar7 == 2) goto LAB_00273e98;
      goto LAB_00273c60;
    }
  }
LAB_00273e92:
  state->phase = FT_LZW_PHASE_EOF;
  FVar8 = FVar14;
LAB_00273e98:
  state->old_code = uVar13;
  state->old_char = uVar12;
  state->in_code = uVar6;
  return FVar8;
}

Assistant:

FT_LOCAL_DEF( FT_ULong )
  ft_lzwstate_io( FT_LzwState  state,
                  FT_Byte*     buffer,
                  FT_ULong     out_size )
  {
    FT_ULong  result = 0;

    FT_UInt  old_char = state->old_char;
    FT_UInt  old_code = state->old_code;
    FT_UInt  in_code  = state->in_code;


    if ( out_size == 0 )
      goto Exit;

    switch ( state->phase )
    {
    case FT_LZW_PHASE_START:
      {
        FT_Byte   max_bits;
        FT_Int32  c;


        /* skip magic bytes, and read max_bits + block_flag */
        if ( FT_Stream_Seek( state->source, 2 ) != 0               ||
             FT_Stream_TryRead( state->source, &max_bits, 1 ) != 1 )
          goto Eof;

        state->max_bits   = max_bits & LZW_BIT_MASK;
        state->block_mode = max_bits & LZW_BLOCK_MASK;
        state->max_free   = (FT_UInt)( ( 1UL << state->max_bits ) - 256 );

        if ( state->max_bits > LZW_MAX_BITS )
          goto Eof;

        state->num_bits = LZW_INIT_BITS;
        state->free_ent = ( state->block_mode ? LZW_FIRST
                                              : LZW_CLEAR ) - 256;
        in_code  = 0;

        state->free_bits = state->num_bits < state->max_bits
                           ? (FT_UInt)( ( 1UL << state->num_bits ) - 256 )
                           : state->max_free + 1;

        c = ft_lzwstate_get_code( state );
        if ( c < 0 || c > 255 )
          goto Eof;

        old_code = old_char = (FT_UInt)c;

        if ( buffer )
          buffer[result] = (FT_Byte)old_char;

        if ( ++result >= out_size )
          goto Exit;

        state->phase = FT_LZW_PHASE_CODE;
      }
      FALL_THROUGH;

    case FT_LZW_PHASE_CODE:
      {
        FT_Int32  c;
        FT_UInt   code;


      NextCode:
        c = ft_lzwstate_get_code( state );
        if ( c < 0 )
          goto Eof;

        code = (FT_UInt)c;

        if ( code == LZW_CLEAR && state->block_mode )
        {
          /* why not LZW_FIRST-256 ? */
          state->free_ent  = ( LZW_FIRST - 1 ) - 256;
          state->buf_clear = 1;

          /* not quite right, but at least more predictable */
          old_code = 0;
          old_char = 0;

          goto NextCode;
        }

        in_code = code; /* save code for later */

        if ( code >= 256U )
        {
          /* special case for KwKwKwK */
          if ( code - 256U >= state->free_ent )
          {
            /* corrupted LZW stream */
            if ( code - 256U > state->free_ent )
              goto Eof;

            FTLZW_STACK_PUSH( old_char );
            code = old_code;
          }

          while ( code >= 256U )
          {
            if ( !state->prefix )
              goto Eof;

            FTLZW_STACK_PUSH( state->suffix[code - 256] );
            code = state->prefix[code - 256];
          }
        }

        old_char = code;
        FTLZW_STACK_PUSH( old_char );

        state->phase = FT_LZW_PHASE_STACK;
      }
      FALL_THROUGH;

    case FT_LZW_PHASE_STACK:
      {
        while ( state->stack_top > 0 )
        {
          state->stack_top--;

          if ( buffer )
            buffer[result] = state->stack[state->stack_top];

          if ( ++result == out_size )
            goto Exit;
        }

        /* now create new entry */
        if ( state->free_ent < state->max_free )
        {
          if ( state->free_ent >= state->prefix_size &&
               ft_lzwstate_prefix_grow( state ) < 0  )
            goto Eof;

          FT_ASSERT( state->free_ent < state->prefix_size );

          state->prefix[state->free_ent] = (FT_UShort)old_code;
          state->suffix[state->free_ent] = (FT_Byte)  old_char;

          state->free_ent += 1;
        }

        old_code = in_code;

        state->phase = FT_LZW_PHASE_CODE;
        goto NextCode;
      }

    default:  /* state == EOF */
      ;
    }

  Exit:
    state->old_code = old_code;
    state->old_char = old_char;
    state->in_code  = in_code;

    return result;

  Eof:
    state->phase = FT_LZW_PHASE_EOF;
    goto Exit;
  }